

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Measurement.cpp
# Opt level: O2

ostream * __thiscall Measurement::toString(Measurement *this,ostream *strm)

{
  long lVar1;
  CoeffReturnType pdVar2;
  int i;
  long lVar3;
  
  lVar3 = 0;
  while( true ) {
    lVar1 = (this->estimate_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
            m_storage.m_rows;
    std::operator<<(strm,"\t");
    if (lVar1 <= lVar3) break;
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->estimate_,lVar3);
    std::ostream::_M_insert<double>(*pdVar2);
    lVar3 = lVar3 + 1;
  }
  std::ostream::_M_insert<double>(this->nis_);
  for (lVar3 = 0;
      lVar3 < (this->ground_truth_).super_PlainObjectBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>_>.
              m_storage.m_rows; lVar3 = lVar3 + 1) {
    std::operator<<(strm,"\t");
    pdVar2 = Eigen::DenseCoeffsBase<Eigen::Matrix<double,_-1,_1,_0,_-1,_1>,_0>::operator()
                       ((DenseCoeffsBase<Eigen::Matrix<double,__1,_1,_0,__1,_1>,_0> *)
                        &this->ground_truth_,lVar3);
    std::ostream::_M_insert<double>(*pdVar2);
  }
  std::operator<<(strm,"\n");
  return strm;
}

Assistant:

std::ostream& Measurement::toString(std::ostream &strm) const {
    // output the estimation
    for (int i=0; i<estimate_.rows(); i++)
        strm << "\t" << estimate_(i);

    strm << "\t" << nis_; // nis

    // output the ground truth packages
    for (int i=0; i<ground_truth_.rows(); i++)
        strm << "\t" << ground_truth_(i);

    strm << "\n";

    return strm;
}